

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O3

_Bool options_restore_custom(player_options *opts,int page)

{
  char *__s;
  _Bool _Var1;
  int iVar2;
  ang_file *f;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  _Bool *p_Var5;
  byte bVar6;
  int opt;
  byte bVar7;
  int *piVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  char file_name [80];
  char buf [1024];
  char path [1024];
  char local_888 [80];
  char local_838 [1024];
  char local_438 [1032];
  
  if ((uint)page < 5) {
    pcVar10 = *(char **)(&DAT_002ce6f8 + (ulong)(uint)page * 8);
  }
  else {
    pcVar10 = "unknown";
  }
  strnfmt(local_888,0x50,"customized_%s_options.txt",pcVar10);
  path_build(local_438,0x400,ANGBAND_DIR_USER,local_888);
  _Var1 = file_exists(local_438);
  if (_Var1) {
    f = file_open(local_438,MODE_READ,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      _Var1 = false;
    }
    else {
      _Var1 = file_getl(f,local_838,0x400);
      if (_Var1) {
        uVar9 = 1;
        do {
          pcVar3 = strstr(local_838,"option:");
          if (pcVar3 == (char *)0x0) {
            pcVar4 = strchr(local_838,0x23);
            if (pcVar4 != (char *)0x0) goto LAB_0019cffb;
LAB_0019cffe:
            _Var1 = contains_only_spaces(local_838);
            if (!_Var1) {
LAB_0019d00a:
              msg("Line %d of the customized %s options is not parseable.",uVar9,pcVar10);
            }
          }
          else {
            *pcVar3 = '\0';
            pcVar4 = strchr(local_838,0x23);
            if (pcVar4 != (char *)0x0) {
LAB_0019cffb:
              *pcVar4 = '\0';
              goto LAB_0019cffe;
            }
            _Var1 = contains_only_spaces(local_838);
            if (!_Var1) goto LAB_0019d00a;
            pcVar4 = pcVar3 + 7;
            piVar8 = &options[0].type;
            lVar11 = 0;
            do {
              if ((*piVar8 == page) &&
                 (__s = ((option_entry *)(piVar8 + -4))->name, __s != (char *)0x0)) {
                __n = strlen(__s);
                iVar2 = strncmp(__s,pcVar4,__n);
                if ((iVar2 == 0) && (pcVar4[__n] == ':')) {
                  bVar7 = pcVar3[__n + 8];
                  iVar2 = bVar7 - 0x79;
                  if ((iVar2 == 0) && (iVar2 = (byte)pcVar4[__n + 2] - 0x65, iVar2 == 0)) {
                    iVar2 = 0x73 - (uint)(byte)pcVar4[__n + 3];
                  }
                  else {
                    iVar2 = -iVar2;
                  }
                  if (iVar2 == 0) {
                    _Var1 = contains_only_spaces(pcVar4 + __n + 4);
                    if (_Var1) {
                      opts->opt[lVar11] = true;
                      goto LAB_0019d01d;
                    }
                    bVar7 = pcVar4[__n + 1];
                  }
                  if (bVar7 == 0x6e) {
                    bVar7 = pcVar4[__n + 2];
                    bVar6 = 0x6f;
                  }
                  else {
                    bVar6 = 0x6e;
                  }
                  if ((bVar6 != bVar7) || (_Var1 = contains_only_spaces(pcVar4 + __n + 3), !_Var1))
                  {
                    pcVar3 = "Value at line %d of the customized %s options is not yes or no.";
                    goto LAB_0019cfc5;
                  }
                  opts->opt[lVar11] = false;
                  goto LAB_0019d01d;
                }
              }
              lVar11 = lVar11 + 1;
              piVar8 = piVar8 + 6;
            } while (lVar11 != 0x2d);
            pcVar3 = "Unrecognized option at line %d of the customized %s options.";
LAB_0019cfc5:
            msg(pcVar3,uVar9,pcVar10);
          }
LAB_0019d01d:
          uVar9 = (ulong)((int)uVar9 + 1);
          _Var1 = file_getl(f,local_838,0x400);
        } while (_Var1);
      }
      _Var1 = file_close(f);
    }
  }
  else {
    p_Var5 = &options[0].normal;
    lVar11 = 0;
    do {
      if (*(int *)(p_Var5 + -4) == page) {
        opts->opt[lVar11] = *p_Var5;
      }
      lVar11 = lVar11 + 1;
      p_Var5 = p_Var5 + 0x18;
    } while (lVar11 != 0x2d);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool options_restore_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	char path[1024], buf[1024], file_name[80];
	ang_file *f;
	int linenum;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	if (!file_exists(path)) {
		options_restore_maintainer(opts, page);
		return true;
	}

	/*
	 * Could use run_parser(), but that exits the application if
	 * there are syntax errors.  Therefore, use our own parsing.
	 */
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	if (!f) {
		return false;
	}
	linenum = 1;
	while (file_getl(f, buf, sizeof(buf))) {
		char *sub = strstr(buf, "option:"), *com;
		int opt;

		if (!sub) {
			/*
			 * If it isn't an option, it should be a comment or
			 * whitespace.
			 */
			sub = strchr(buf, '#');

			if (sub) {
				*sub = '\0';
			}
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}

		*sub = '\0';
		/* Ignore if the "option:" is embedded in a comment. */
		com = strchr(buf, '#');
		if (com) {
			*com = '\0';
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}
		if (!contains_only_spaces(buf)) {
			msg("Line %d of the customized %s options is not "
					"parseable.", linenum, page_name);
			++linenum;
			continue;
		}

		/* Try to find the option. */
		sub += 7;
		opt = 0;
		while (1) {
			size_t lname;

			if (opt >= OPT_MAX) {
				msg("Unrecognized option at line %d of the "
					"customized %s options.", linenum,
					page_name);
				break;
			}
			if (options[opt].type != page || !options[opt].name) {
				++opt;
				continue;
			}
			lname = strlen(options[opt].name);
			if (strncmp(options[opt].name, sub, lname) == 0
					&& sub[lname] == ':') {
				if (strncmp("yes", sub + lname + 1, 3) == 0
						&& contains_only_spaces(sub + lname + 4)) {
					(*opts).opt[opt] = true;
				} else if (strncmp("no", sub + lname + 1, 2) == 0
						&& contains_only_spaces(sub + lname + 3)) {
					(*opts).opt[opt] = false;
				} else {
					msg("Value at line %d of the "
						"customized %s options is not "
						"yes or no.", linenum,
						page_name);
				}
				break;
			}
			++opt;
		}
		++linenum;
	}

	if (!file_close(f)) {
		return false;
	}

	return true;
}